

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O2

string * __thiscall
setup::filename_map::convert(string *__return_storage_ptr__,filename_map *this,string *path)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  it begin;
  string expanded;
  it local_58;
  string local_50;
  
  if (this->lowercase == true) {
    pcVar1 = (path->_M_dataplus)._M_p;
    sVar2 = path->_M_string_length;
    for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
      iVar3 = tolower((int)pcVar1[sVar4]);
      pcVar1[sVar4] = (char)iVar3;
    }
  }
  if (this->expand == false) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  }
  else {
    local_58._M_current = (path->_M_dataplus)._M_p;
    expand_variables(&local_50,this,&local_58,(it)(local_58._M_current + path->_M_string_length),
                     false);
    shorten_path(__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string filename_map::convert(std::string path) const {
	
	// Convert paths to lower-case if requested
	if(lowercase) {
		std::transform(path.begin(), path.end(), path.begin(), ::tolower);
	}
	
	// Don't expand variables if requested
	if(!expand) {
		return path;
	}
	
	it begin = path.begin();
	std::string expanded = expand_variables(begin, path.end());
	
	return shorten_path(expanded);
}